

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  clipperException *this_00;
  TEdge *pTVar3;
  _func_int *p_Var4;
  TEdge *pTVar5;
  TEdge **ppTVar6;
  bool bVar7;
  
  pTVar1 = GetMaximaPairEx(e);
  if (pTVar1 == (TEdge *)0x0) {
    if (-1 < e->OutIdx) {
      AddOutPt(this,e,&e->Top);
    }
    pTVar2 = e->NextInAEL;
    pTVar3 = e->PrevInAEL;
    if (((pTVar3 == (TEdge *)0x0) && (pTVar2 == (TEdge *)0x0)) &&
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != e)) {
      return;
    }
    ppTVar6 = &e->NextInAEL;
    pTVar1 = pTVar3;
    if (pTVar3 == (TEdge *)0x0) {
      pTVar1 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
    }
    pTVar1->NextInAEL = pTVar2;
    goto LAB_00113176;
  }
  pTVar2 = e->NextInAEL;
  bVar7 = pTVar2 != (TEdge *)0x0;
  if (pTVar2 != pTVar1 && bVar7) {
    do {
      IntersectEdges(this,e,pTVar2,&e->Top);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e,
                 pTVar2);
      pTVar2 = e->NextInAEL;
      bVar7 = pTVar2 != (TEdge *)0x0;
      if (pTVar2 == (TEdge *)0x0) break;
    } while (pTVar2 != pTVar1);
  }
  if (e->OutIdx == -1) {
    if (pTVar1->OutIdx != -1) goto LAB_00113022;
    p_Var4 = this->_vptr_Clipper[-3];
    pTVar3 = e->PrevInAEL;
    if (((bool)(pTVar3 != (TEdge *)0x0 | bVar7)) ||
       (pTVar5 = *(TEdge **)
                  (p_Var4 + 0x10 +
                  (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>),
       pTVar5 == e)) {
      pTVar5 = pTVar3;
      if (pTVar3 == (TEdge *)0x0) {
        pTVar5 = (TEdge *)((long)&this->_vptr_Clipper + (long)p_Var4);
      }
      pTVar5->NextInAEL = pTVar2;
      if (bVar7) {
        pTVar2->PrevInAEL = pTVar3;
      }
LAB_00113136:
      e->NextInAEL = (TEdge *)0x0;
      e->PrevInAEL = (TEdge *)0x0;
      p_Var4 = this->_vptr_Clipper[-3];
      pTVar5 = *(TEdge **)
                (p_Var4 + 0x10 +
                (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
    }
LAB_0011314a:
    pTVar2 = pTVar1->NextInAEL;
    pTVar3 = pTVar1->PrevInAEL;
    if (((pTVar3 == (TEdge *)0x0) && (pTVar2 == (TEdge *)0x0)) && (pTVar5 != pTVar1)) {
      return;
    }
    pTVar5 = (TEdge *)((long)&this->_vptr_Clipper + (long)p_Var4);
    if (pTVar3 != (TEdge *)0x0) {
      pTVar5 = pTVar3;
    }
    pTVar5->NextInAEL = pTVar2;
  }
  else {
    if (e->OutIdx < 0) {
LAB_00113022:
      if (e->WindDelta != 0) {
LAB_00113190:
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"DoMaxima error");
        __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
      }
    }
    else {
      if (-1 < pTVar1->OutIdx) {
        AddLocalMaxPoly(this,e,pTVar1,&e->Top);
        p_Var4 = this->_vptr_Clipper[-3];
        pTVar2 = e->NextInAEL;
        pTVar3 = e->PrevInAEL;
        if (((pTVar3 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) ||
           (pTVar5 = *(TEdge **)
                      (p_Var4 + 0x10 +
                      (long)&(this->m_Maxima).
                             super__List_base<long_long,_std::allocator<long_long>_>), pTVar5 == e))
        {
          pTVar5 = pTVar3;
          if (pTVar3 == (TEdge *)0x0) {
            pTVar5 = (TEdge *)((long)&this->_vptr_Clipper + (long)p_Var4);
          }
          pTVar5->NextInAEL = pTVar2;
          if (pTVar2 != (TEdge *)0x0) {
            pTVar2->PrevInAEL = pTVar3;
          }
          goto LAB_00113136;
        }
        goto LAB_0011314a;
      }
      if (e->WindDelta != 0) goto LAB_00113190;
      AddOutPt(this,e,&e->Top);
      e->OutIdx = -1;
      pTVar2 = e->NextInAEL;
    }
    pTVar3 = e->PrevInAEL;
    if (((pTVar3 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) ||
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) == e)) {
      pTVar5 = pTVar3;
      if (pTVar3 == (TEdge *)0x0) {
        pTVar5 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      }
      pTVar5->NextInAEL = pTVar2;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->PrevInAEL = pTVar3;
      }
      e->NextInAEL = (TEdge *)0x0;
      e->PrevInAEL = (TEdge *)0x0;
    }
    if (-1 < pTVar1->OutIdx) {
      AddOutPt(this,pTVar1,&e->Top);
      pTVar1->OutIdx = -1;
    }
    pTVar2 = pTVar1->NextInAEL;
    pTVar3 = pTVar1->PrevInAEL;
    if (((pTVar3 == (TEdge *)0x0) && (pTVar2 == (TEdge *)0x0)) &&
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != pTVar1)
       ) {
      return;
    }
    pTVar5 = pTVar3;
    if (pTVar3 == (TEdge *)0x0) {
      pTVar5 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
    }
    pTVar5->NextInAEL = pTVar2;
  }
  ppTVar6 = &pTVar1->NextInAEL;
LAB_00113176:
  if (pTVar2 != (TEdge *)0x0) {
    pTVar2->PrevInAEL = pTVar3;
  }
  *ppTVar6 = (TEdge *)0x0;
  ppTVar6[1] = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e)
{
  TEdge* eMaxPair = GetMaximaPairEx(e);
  if (!eMaxPair)
  {
    if (e->OutIdx >= 0)
      AddOutPt(e, e->Top);
    DeleteFromAEL(e);
    return;
  }

  TEdge* eNext = e->NextInAEL;
  while(eNext && eNext != eMaxPair)
  {
    IntersectEdges(e, eNext, e->Top);
    SwapPositionsInAEL(e, eNext);
    eNext = e->NextInAEL;
  }

  if(e->OutIdx == Unassigned && eMaxPair->OutIdx == Unassigned)
  {
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
  else if( e->OutIdx >= 0 && eMaxPair->OutIdx >= 0 )
  {
    if (e->OutIdx >= 0) AddLocalMaxPoly(e, eMaxPair, e->Top);
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
#ifdef use_lines
  else if (e->WindDelta == 0)
  {
    if (e->OutIdx >= 0) 
    {
      AddOutPt(e, e->Top);
      e->OutIdx = Unassigned;
    }
    DeleteFromAEL(e);

    if (eMaxPair->OutIdx >= 0)
    {
      AddOutPt(eMaxPair, e->Top);
      eMaxPair->OutIdx = Unassigned;
    }
    DeleteFromAEL(eMaxPair);
  } 
#endif
  else throw clipperException("DoMaxima error");
}